

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakevfs.cpp
# Opt level: O2

int __thiscall QMakeVfs::idForFileName(QMakeVfs *this,QString *fn,VfsFlags flags)

{
  int iVar1;
  int *key;
  QString *this_00;
  
  if (((uint)flags.super_QFlagsStorageHelper<QMakeVfs::VfsFlag,_4>.
             super_QFlagsStorage<QMakeVfs::VfsFlag>.i & 0x10) == 0) {
    key = QHash<QString,_int>::operator[](&s_fileIdMap,fn);
    iVar1 = *key;
    if (iVar1 == 0) {
      LOCK();
      UNLOCK();
      iVar1 = (int)s_fileIdCounter.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                   .super___atomic_base<int>._M_i + 1;
      s_fileIdCounter.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (QAtomicInteger<int>)
           (QAtomicInteger<int>)
           ((int)s_fileIdCounter.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                 super___atomic_base<int>._M_i + 1);
      *key = iVar1;
      this_00 = QHash<int,_QString>::operator[](&s_idFileMap,key);
      QString::operator=(this_00,(QString *)fn);
      iVar1 = *key;
    }
    return iVar1;
  }
  iVar1 = QHash<QString,_int>::value(&s_fileIdMap,fn);
  return iVar1;
}

Assistant:

int QMakeVfs::idForFileName(const QString &fn, VfsFlags flags)
{
#ifdef PROEVALUATOR_DUAL_VFS
    {
# ifdef PROPARSER_THREAD_SAFE
        QMutexLocker locker(&m_vmutex);
# endif
        int idx = (flags & VfsCumulative) ? 1 : 0;
        if (flags & VfsCreate) {
            int &id = m_virtualFileIdMap[idx][fn];
            if (!id) {
                id = ++s_fileIdCounter;
                m_virtualIdFileMap[id] = fn;
            }
            return id;
        }
        int id = m_virtualFileIdMap[idx].value(fn);
        if (id || (flags & VfsCreatedOnly))
            return id;
    }
#endif
#ifdef PROPARSER_THREAD_SAFE
    QMutexLocker locker(&s_mutex);
#endif
    if (!(flags & VfsAccessedOnly)) {
        int &id = s_fileIdMap[fn];
        if (!id) {
            id = ++s_fileIdCounter;
            s_idFileMap[id] = fn;
        }
        return id;
    }
    return s_fileIdMap.value(fn);
}